

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pure.cpp
# Opt level: O1

string * fs_with_suffix_abi_cxx11_(string_view path,string_view new_suffix)

{
  string_view other;
  string_view path_00;
  string_view path_01;
  path *this;
  size_t in_RCX;
  char *in_RDX;
  char *unaff_RBX;
  size_t in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  char *in_R8;
  string stem;
  allocator<char> local_a1;
  basic_string_view<char,_std::char_traits<char>_> local_a0;
  basic_string_view<char,_std::char_traits<char>_> local_90;
  long *local_80;
  long local_78;
  long local_70 [2];
  path local_60;
  size_t in_stack_ffffffffffffffe8;
  
  path_01._M_str = unaff_RBX;
  path_01._M_len = in_stack_ffffffffffffffe8;
  local_a0._M_len = in_RCX;
  local_a0._M_str = in_R8;
  local_90._M_len = in_RSI;
  local_90._M_str = in_RDX;
  fs_stem_abi_cxx11_(path_01);
  if (local_78 == 0) {
    path_00._M_str = local_90._M_str;
    path_00._M_len = local_90._M_len;
    other._M_str = local_a0._M_str;
    other._M_len = local_a0._M_len;
    fs_join_abi_cxx11_(in_RDI,path_00,other);
  }
  else {
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              ((path *)&stack0xffffffffffffffc8,&local_90,auto_format);
    std::filesystem::__cxx11::path::
    path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
              (&local_60,&local_a0,auto_format);
    this = (path *)std::filesystem::__cxx11::path::replace_extension
                             ((path *)&stack0xffffffffffffffc8);
    std::filesystem::__cxx11::path::generic_string<char,std::char_traits<char>,std::allocator<char>>
              (in_RDI,this,&local_a1);
    std::filesystem::__cxx11::path::~path(&local_60);
    std::filesystem::__cxx11::path::~path((path *)&stack0xffffffffffffffc8);
  }
  if (local_80 != local_70) {
    operator_delete(local_80,local_70[0] + 1);
  }
  return in_RDI;
}

Assistant:

std::string fs_with_suffix(std::string_view path, std::string_view new_suffix)
{
  const std::string stem = fs_stem(path);
  // handle directory case: stem is empty
  if(stem.empty())
    return fs_join(path, new_suffix);

#ifdef HAVE_CXX_FILESYSTEM
  return std::filesystem::path(path).replace_extension(new_suffix).generic_string();
#else
  const std::string p = fs_parent(path);

  const std::string r = (p == ".") ? stem : p + "/" + stem;

  return r + std::string(new_suffix);

#endif
}